

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# preprocessor.cpp
# Opt level: O2

void __thiscall
r_comp::Preprocessor::instantiateClass
          (Preprocessor *this,Ptr *tpl_class,
          vector<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
          *tpl_args,string *instantiated_class_name)

{
  __shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2> *p_Var1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  mapped_type *this_00;
  Class *pCVar3;
  Class *this_01;
  __shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2> *p_Var4;
  Atom local_22c [4];
  vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_> members;
  __shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2> local_200;
  vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_> local_1f0;
  list<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
  _tpl_args;
  string local_1c0;
  string sset;
  Ptr replistruct;
  char buffer [255];
  
  std::__cxx11::string::string((string *)&sset,"[]",(allocator *)buffer);
  std::__cxx11::string::_M_assign((string *)instantiated_class_name);
  std::__cxx11::string::substr((ulong)buffer,(ulong)instantiated_class_name);
  std::__cxx11::string::operator=((string *)instantiated_class_name,(string *)buffer);
  std::__cxx11::string::~string((string *)buffer);
  instantiateClass::LastClassID = instantiateClass::LastClassID + 1;
  sprintf(buffer,"%lu");
  std::__cxx11::string::append((char *)instantiated_class_name);
  members.super__Vector_base<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  members.super__Vector_base<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  members.super__Vector_base<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  _tpl_args.
  super__List_base<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
  ._M_impl._M_node._M_size = 0;
  p_Var1 = &((tpl_args->
             super__Vector_base<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
             )._M_impl.super__Vector_impl_data._M_finish)->
            super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>;
  _tpl_args.
  super__List_base<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&_tpl_args;
  _tpl_args.
  super__List_base<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&_tpl_args;
  for (p_Var4 = &((tpl_args->
                  super__Vector_base<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
                  )._M_impl.super__Vector_impl_data._M_start)->
                 super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>;
      p_Var4 != p_Var1; p_Var4 = p_Var4 + 1) {
    std::__shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&replistruct.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>,
               p_Var4);
    std::__cxx11::
    list<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
    ::push_back(&_tpl_args,
                (value_type *)
                &replistruct.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&replistruct.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  }
  std::__shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_200,
             &tpl_class->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>);
  getMembers(this,(Ptr *)&local_200,&members,&_tpl_args,true);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_200._M_refcount);
  pbVar2 = r_code::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::operator[](&this->m_metadata->class_names,(ulong)this->m_classOpcode);
  std::__cxx11::string::_M_assign((string *)pbVar2);
  r_code::Atom::SSet((ushort)local_22c,(uchar)this->m_classOpcode);
  std::__cxx11::string::string((string *)&local_1c0,(string *)instantiated_class_name);
  std::vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>::vector
            (&local_1f0,&members);
  Class::Class((Class *)&replistruct,local_22c,&local_1c0,&local_1f0,ANY);
  this_00 = std::__detail::
            _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
            ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                          *)this->m_metadata,instantiated_class_name);
  pCVar3 = Class::operator=(this_00,(Class *)&replistruct);
  this_01 = r_code::vector<r_comp::Class>::operator[]
                      (&this->m_metadata->classes_by_opcodes,(ulong)this->m_classOpcode);
  Class::operator=(this_01,pCVar3);
  Class::~Class((Class *)&replistruct);
  std::vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>::~vector
            (&local_1f0);
  std::__cxx11::string::~string((string *)&local_1c0);
  r_code::Atom::~Atom(local_22c);
  this->m_classOpcode = this->m_classOpcode + 1;
  std::__cxx11::
  _List_base<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
  ::_M_clear(&_tpl_args.
              super__List_base<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
            );
  std::vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>::~vector(&members);
  std::__cxx11::string::~string((string *)&sset);
  return;
}

Assistant:

void Preprocessor::instantiateClass(RepliStruct::Ptr tpl_class, std::vector<RepliStruct::Ptr> &tpl_args, std::string &instantiated_class_name)
{
    static uint64_t LastClassID = 0;
    // remove the trailing [].
    std::string sset = "[]";
    instantiated_class_name = tpl_class->cmd;
    instantiated_class_name = instantiated_class_name.substr(0, instantiated_class_name.length() - sset.length());
    // append an ID to the tpl class name.
    char buffer[255];
    sprintf(buffer, "%lu", LastClassID++);
    instantiated_class_name += buffer;
    std::vector<StructureMember> members;
    std::list<RepliStruct::Ptr> _tpl_args;

    for (RepliStruct::Ptr replistruct : tpl_args) {
        _tpl_args.push_back(replistruct);
    }

    getMembers(tpl_class, members, _tpl_args, true);
    m_metadata->class_names[m_classOpcode] = instantiated_class_name;
    m_metadata->classes_by_opcodes[m_classOpcode] = m_metadata->classes[instantiated_class_name] = Class(Atom::SSet(m_classOpcode, members.size()), instantiated_class_name, members);
    ++m_classOpcode;
}